

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment.cpp
# Opt level: O0

Alignment * __thiscall
jhu::thrax::readAlignment(Alignment *__return_storage_ptr__,thrax *this,string_view sv)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  size_type __n;
  long lVar2;
  invalid_argument *piVar3;
  iterator iVar4;
  iterator iVar5;
  allocator<char> local_b1;
  string local_b0 [38];
  undefined1 local_8a;
  allocator<char> local_89;
  string local_88 [32];
  reference local_68;
  Point *p;
  iterator __end2;
  iterator __begin2;
  Alignment *__range2;
  char *e;
  const_pointer s;
  allocator<jhu::thrax::Point> local_23;
  char local_22 [2];
  undefined1 local_20 [8];
  string_view sv_local;
  Alignment *result;
  
  sv_local._M_len = sv._M_len;
  local_22[1] = 0;
  local_20 = (undefined1  [8])this;
  sv_local._M_str = (char *)__return_storage_ptr__;
  __first = std::basic_string_view<char,_std::char_traits<char>_>::begin
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  local_22[0] = '-';
  __n = std::count<char_const*,char>(__first,__last,local_22);
  std::allocator<jhu::thrax::Point>::allocator(&local_23);
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::vector
            (__return_storage_ptr__,__n,&local_23);
  std::allocator<jhu::thrax::Point>::~allocator(&local_23);
  e = std::basic_string_view<char,_std::char_traits<char>_>::data
                ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  __end2 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::begin
                     (__return_storage_ptr__);
  p = (Point *)std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::end
                         (__return_storage_ptr__);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
                                *)&p);
    if (!bVar1) {
      iVar4 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::begin
                        (__return_storage_ptr__);
      iVar5 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::end
                        (__return_storage_ptr__);
      std::
      sort<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,jhu::thrax::__0>
                (iVar4._M_current,iVar5._M_current);
      return __return_storage_ptr__;
    }
    local_68 = __gnu_cxx::
               __normal_iterator<jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
               ::operator*(&__end2);
    lVar2 = strtol(e,(char **)&__range2,10);
    local_68->src = (PointType)lVar2;
    if (__range2 == (Alignment *)e) break;
    e = (char *)__range2;
    lVar2 = strtol((char *)__range2,(char **)&__range2,10);
    local_68->tgt = -(short)lVar2;
    if (__range2 == (Alignment *)e) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_b0,(basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_b1);
      std::invalid_argument::invalid_argument(piVar3,local_b0);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    e = (char *)__range2;
    __gnu_cxx::
    __normal_iterator<jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
    ::operator++(&__end2);
  }
  local_8a = 1;
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_88,(basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_89);
  std::invalid_argument::invalid_argument(piVar3,local_88);
  local_8a = 0;
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Alignment readAlignment(std::string_view sv) {
  Alignment result(std::count(sv.begin(), sv.end(), '-'));
  auto s = sv.data();
  char* e;
  for (auto& p : result) {
    p.src = std::strtol(s, &e, 10);
    if (e == s) {
      throw std::invalid_argument(std::string(sv));
    }
    s = e;
    p.tgt = -std::strtol(s, &e, 10);
    if (e == s) {
      throw std::invalid_argument(std::string(sv));
    }
    s = e;
  }
  std::sort(result.begin(), result.end(), bySource);
  return result;
}